

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O2

PyObject * libxml_xmlRecoverMemory(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlDocPtr doc;
  PyObject *pPVar2;
  int size;
  char *buffer;
  Py_ssize_t py_buffsize0;
  undefined4 local_24;
  undefined8 local_20;
  undefined1 local_18 [8];
  
  iVar1 = libxml_deprecationWarning("xmlRecoverMemory");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT(args,"s#i:xmlRecoverMemory",&local_20,local_18,&local_24);
    if (iVar1 != 0) {
      doc = (xmlDocPtr)xmlRecoverMemory(local_20,local_24);
      pPVar2 = libxml_xmlDocPtrWrap(doc);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlRecoverMemory(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlDocPtr c_retval;
    char * buffer;
    Py_ssize_t  py_buffsize0;
    int size;

    if (libxml_deprecationWarning("xmlRecoverMemory") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"s#i:xmlRecoverMemory", &buffer, &py_buffsize0, &size))
        return(NULL);

    c_retval = xmlRecoverMemory(buffer, size);
    py_retval = libxml_xmlDocPtrWrap((xmlDocPtr) c_retval);
    return(py_retval);
}